

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcertificate.cpp
# Opt level: O1

QString * __thiscall
QSslCertificate::subjectDisplayName(QString *__return_storage_ptr__,QSslCertificate *this)

{
  _Tuple_impl<0UL,_QTlsPrivate::X509Certificate_*,_std::default_delete<QTlsPrivate::X509Certificate>_>
  _Var1;
  Data *pDVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_78;
  QArrayDataPointer<QString> local_58;
  QArrayDataPointer<QString> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)0x0;
  local_58.size = 0;
  _Var1.super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl =
       (((this->d).d.ptr)->backend)._M_t.
       super___uniq_ptr_impl<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QTlsPrivate::X509Certificate_*,_std::default_delete<QTlsPrivate::X509Certificate>_>
       .super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>;
  if (_Var1.super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl ==
      (X509Certificate *)0x0) {
    local_78.d = (Data *)0x0;
    local_78.ptr = (QString *)0x0;
    local_78.size = 0;
  }
  else {
    (**(code **)(*(long *)_Var1.super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>.
                          _M_head_impl + 0x48))
              (&local_78,
               _Var1.super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl,1);
  }
  local_38.size = local_58.size;
  local_38.ptr = local_58.ptr;
  local_38.d = local_58.d;
  local_58.size = local_78.size;
  local_58.ptr = local_78.ptr;
  local_58.d = local_78.d;
  local_78.d = (Data *)0x0;
  local_78.ptr = (QString *)0x0;
  local_78.size = 0;
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_38);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  if (local_58.size == 0) {
    _Var1.super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl =
         (((this->d).d.ptr)->backend)._M_t.
         super___uniq_ptr_impl<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
         ._M_t.
         super__Tuple_impl<0UL,_QTlsPrivate::X509Certificate_*,_std::default_delete<QTlsPrivate::X509Certificate>_>
         .super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>;
    if (_Var1.super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl ==
        (X509Certificate *)0x0) {
      local_78.d = (Data *)0x0;
      local_78.ptr = (QString *)0x0;
      local_78.size = 0;
    }
    else {
      (**(code **)(*(long *)_Var1.super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>.
                            _M_head_impl + 0x48))
                (&local_78,
                 _Var1.super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl,0);
    }
    local_38.size = local_58.size;
    local_38.ptr = local_58.ptr;
    local_38.d = local_58.d;
    local_58.size = local_78.size;
    local_58.ptr = local_78.ptr;
    local_58.d = local_78.d;
    local_78.d = (Data *)0x0;
    local_78.ptr = (QString *)0x0;
    local_78.size = 0;
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_38);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
    if (local_58.size == 0) {
      _Var1.super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl =
           (((this->d).d.ptr)->backend)._M_t.
           super___uniq_ptr_impl<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
           ._M_t.
           super__Tuple_impl<0UL,_QTlsPrivate::X509Certificate_*,_std::default_delete<QTlsPrivate::X509Certificate>_>
           .super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>;
      if (_Var1.super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl ==
          (X509Certificate *)0x0) {
        local_78.d = (Data *)0x0;
        local_78.ptr = (QString *)0x0;
        local_78.size = 0;
      }
      else {
        (**(code **)(*(long *)_Var1.super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>.
                              _M_head_impl + 0x48))
                  (&local_78,
                   _Var1.super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl,3
                  );
      }
      local_38.size = local_58.size;
      local_38.ptr = local_58.ptr;
      local_38.d = local_58.d;
      local_58.size = local_78.size;
      local_58.ptr = local_78.ptr;
      local_58.d = local_78.d;
      local_78.d = (Data *)0x0;
      local_78.ptr = (QString *)0x0;
      local_78.size = 0;
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_38);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
      if (local_58.size == 0) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        goto LAB_001cebee;
      }
    }
  }
  pDVar2 = ((local_58.ptr)->d).d;
  (__return_storage_ptr__->d).d = pDVar2;
  (__return_storage_ptr__->d).ptr = ((local_58.ptr)->d).ptr;
  (__return_storage_ptr__->d).size = ((local_58.ptr)->d).size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
LAB_001cebee:
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QSslCertificate::subjectDisplayName() const
{
    QStringList names;
    names = subjectInfo(QSslCertificate::CommonName);
    if (!names.isEmpty())
        return names.constFirst();
    names = subjectInfo(QSslCertificate::Organization);
    if (!names.isEmpty())
        return names.constFirst();
    names = subjectInfo(QSslCertificate::OrganizationalUnitName);
    if (!names.isEmpty())
        return names.constFirst();

    return QString();
}